

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O1

bool cmPolicies::ApplyPolicyVersion
               (cmMakefile *mf,uint majorVer,uint minorVer,uint patchVer,WarnCompat warnCompat)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  cmListFileContext *pcVar8;
  char *__s;
  string *psVar9;
  ostream *poVar10;
  cmState *this;
  cmValue cVar11;
  uint uVar12;
  uint uVar13;
  PolicyID id;
  PolicyStatus status;
  cmMakefile *this_00;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  string defaultVar;
  ostringstream e;
  allocator<char> local_221;
  cmMakefile *local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_1b8;
  undefined1 local_1a8 [16];
  undefined1 local_198 [360];
  
  local_220 = mf;
  if (warnCompat == On) {
    if ((1 < majorVer) && (majorVer != 2 || 7 < minorVer)) {
      bVar4 = false;
      if ((majorVer != 2) || (minorVer != 8)) goto LAB_0042e1b3;
      bVar15 = false;
      if (0xb < patchVer) goto LAB_0042e1ba;
    }
    bVar15 = true;
    if ((minorVer == 6 && majorVer == 2) && patchVer == 0) {
      cmMakefile::GetStateSnapshot(mf);
      bVar4 = cmStateSnapshot::CanPopPolicyScope((cmStateSnapshot *)local_1a8);
      if (bVar4) {
        cmMakefile::GetBacktrace(mf);
        pcVar8 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top(&local_1b8);
        iVar6 = cmsys::SystemTools::Strucmp((pcVar8->Name)._M_dataplus._M_p,"cmake_policy");
        bVar15 = iVar6 != 0;
        bVar4 = true;
        goto LAB_0042e1ba;
      }
    }
    bVar4 = false;
  }
  else {
LAB_0042e1b3:
    bVar4 = false;
    bVar15 = false;
  }
LAB_0042e1ba:
  if ((bVar4) &&
     (local_1b8.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b8.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (bVar15) {
    local_1a8._0_8_ = (cmState *)local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "Compatibility with CMake < 2.8.12 will be removed from a future version of CMake.\nUpdate the VERSION argument <min> value or use a ...<max> suffix to tell CMake that the project does not need compatibility with older versions."
               ,"");
    cmMakefile::IssueMessage(local_220,DEPRECATION_WARNING,(string *)local_1a8);
    if ((cmState *)local_1a8._0_8_ != (cmState *)local_198) {
      operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
    }
  }
  bVar16 = majorVer == 3;
  uVar12 = minorVer + 1;
  uVar13 = patchVer + 1;
  bVar17 = patchVer == 0xffffffff;
  bVar14 = 8 < uVar12;
  bVar4 = minorVer == 8 && bVar17;
  bVar18 = majorVer == 2;
  bVar15 = false;
  id = CMP0000;
  this_00 = local_220;
  do {
    uVar2 = uVar13 < 4;
    switch(id) {
    case CMP0000:
    case CMP0001:
    case CMP0002:
    case CMP0003:
    case CMP0004:
    case CMP0005:
    case CMP0006:
    case CMP0007:
      bVar5 = 6 < uVar12 || !bVar18;
      bVar19 = minorVer == 6 && bVar17;
      goto joined_r0x0042e783;
    case CMP0008:
      uVar2 = uVar13 < 2;
      goto joined_r0x0042e81f;
    case CMP0009:
      uVar2 = uVar13 < 3;
      goto joined_r0x0042e81f;
    case CMP0010:
    case CMP0011:
joined_r0x0042e81f:
      uVar1 = 6 < uVar12 || !bVar18;
      uVar3 = minorVer == 6;
      goto joined_r0x0042e793;
    case CMP0012:
    case CMP0013:
    case CMP0014:
      bVar5 = bVar14 || !bVar18;
      bVar19 = bVar4;
joined_r0x0042e783:
      uVar2 = bVar19 && bVar18;
      if (bVar5 && 1 < majorVer) goto LAB_0042e8e5;
      goto LAB_0042e8ed;
    case CMP0015:
      uVar2 = uVar13 < 2;
      goto joined_r0x0042e793;
    case CMP0016:
      goto joined_r0x0042e793;
    case CMP0017:
      uVar2 = uVar13 < 5;
      goto joined_r0x0042e793;
    case CMP0018:
      uVar2 = uVar13 < 10;
      goto joined_r0x0042e793;
    case CMP0019:
    case CMP0020:
      uVar2 = uVar13 < 0xc;
      goto joined_r0x0042e793;
    case CMP0021:
    case CMP0022:
    case CMP0023:
      uVar2 = uVar13 < 0xd;
joined_r0x0042e793:
      uVar1 = bVar14 || !bVar18;
      uVar3 = minorVer == 8;
joined_r0x0042e793:
      if ((bool)uVar1 && 1 < majorVer) {
        if ((bool)uVar3 && bVar18) goto LAB_0042e8e5;
        goto switchD_0042e660_default;
      }
      goto LAB_0042e8ed;
    case CMP0024:
    case CMP0025:
    case CMP0026:
    case CMP0027:
    case CMP0028:
    case CMP0029:
    case CMP0030:
    case CMP0031:
    case CMP0032:
    case CMP0033:
    case CMP0034:
    case CMP0035:
    case CMP0036:
    case CMP0037:
    case CMP0038:
    case CMP0039:
    case CMP0040:
    case CMP0041:
    case CMP0042:
    case CMP0043:
    case CMP0044:
    case CMP0045:
    case CMP0046:
    case CMP0047:
    case CMP0048:
    case CMP0049:
    case CMP0050:
      bVar5 = minorVer != 0xffffffff || !bVar16;
      bVar19 = minorVer == 0;
      goto joined_r0x0042e6a7;
    case CMP0051:
    case CMP0052:
    case CMP0053:
    case CMP0054:
      bVar5 = 1 < uVar12 || !bVar16;
      bVar19 = minorVer == 1;
      goto joined_r0x0042e6a7;
    case CMP0055:
    case CMP0056:
      bVar5 = 2 < uVar12 || !bVar16;
      bVar19 = minorVer == 2;
      goto joined_r0x0042e6a7;
    case CMP0057:
    case CMP0058:
    case CMP0059:
    case CMP0060:
    case CMP0061:
    case CMP0062:
    case CMP0063:
      bVar5 = 3 < uVar12 || !bVar16;
      bVar19 = minorVer == 3;
joined_r0x0042e6a7:
      bVar19 = bVar19 && bVar17;
      goto joined_r0x0042e76f;
    case CMP0064:
    case CMP0065:
      bVar5 = 4 < uVar12 || !bVar16;
      bVar19 = minorVer == 4;
      goto joined_r0x0042e85f;
    case CMP0066:
      bVar5 = 7 < uVar12 || !bVar16;
      bVar19 = minorVer == 7;
joined_r0x0042e85f:
      bVar19 = bVar19 && bVar17;
      goto joined_r0x0042e76f;
    case CMP0067:
      bVar5 = !bVar16 || bVar14;
      bVar19 = bVar4;
      goto joined_r0x0042e76f;
    case CMP0068:
    case CMP0069:
      bVar5 = 9 < uVar12 || !bVar16;
      bVar19 = minorVer == 9 && bVar17;
      goto joined_r0x0042e76f;
    case CMP0070:
    case CMP0071:
      bVar5 = 10 < uVar12 || !bVar16;
      bVar19 = minorVer == 10;
      break;
    case CMP0072:
      bVar5 = 0xb < uVar12 || !bVar16;
      bVar19 = minorVer == 0xb;
      break;
    case CMP0073:
    case CMP0074:
    case CMP0075:
      bVar5 = 0xc < uVar12 || !bVar16;
      bVar19 = minorVer == 0xc;
      break;
    case CMP0076:
    case CMP0077:
    case CMP0078:
    case CMP0079:
    case CMP0080:
    case CMP0081:
      bVar5 = 0xd < uVar12 || !bVar16;
      bVar19 = minorVer == 0xd;
      break;
    case CMP0082:
    case CMP0083:
    case CMP0084:
    case CMP0085:
    case CMP0086:
    case CMP0087:
    case CMP0088:
      bVar5 = 0xe < uVar12 || !bVar16;
      bVar19 = minorVer == 0xe;
      break;
    case CMP0089:
    case CMP0090:
    case CMP0091:
    case CMP0092:
    case CMP0093:
    case CMP0094:
      bVar5 = 0xf < uVar12 || !bVar16;
      bVar19 = minorVer == 0xf;
      break;
    case CMP0095:
    case CMP0096:
    case CMP0097:
      bVar5 = 0x10 < uVar12 || !bVar16;
      bVar19 = minorVer == 0x10;
      break;
    case CMP0098:
    case CMP0099:
    case CMP0100:
    case CMP0101:
    case CMP0102:
      bVar5 = 0x11 < uVar12 || !bVar16;
      bVar19 = minorVer == 0x11;
      break;
    case CMP0103:
    case CMP0104:
    case CMP0105:
    case CMP0106:
    case CMP0107:
    case CMP0108:
      bVar5 = 0x12 < uVar12 || !bVar16;
      bVar19 = minorVer == 0x12;
      goto joined_r0x0042e71f;
    case CMP0109:
    case CMP0110:
    case CMP0111:
    case CMP0112:
    case CMP0113:
    case CMP0114:
      bVar5 = 0x13 < uVar12 || !bVar16;
      bVar19 = minorVer == 0x13;
      goto joined_r0x0042e71f;
    case CMP0115:
    case CMP0116:
    case CMP0117:
    case CMP0118:
    case CMP0119:
    case CMP0120:
      bVar5 = 0x14 < uVar12 || !bVar16;
      bVar19 = minorVer == 0x14;
      goto joined_r0x0042e71f;
    case CMP0121:
    case CMP0122:
    case CMP0123:
    case CMP0124:
    case CMP0125:
    case CMP0126:
      bVar5 = 0x15 < uVar12 || !bVar16;
      bVar19 = minorVer == 0x15;
joined_r0x0042e71f:
      bVar19 = bVar19 && bVar17;
      goto joined_r0x0042e76f;
    case CMP0127:
    case CMP0128:
      bVar5 = 0x16 < uVar12 || !bVar16;
      bVar19 = minorVer == 0x16;
      goto joined_r0x0042e89a;
    case CMP0129:
      bVar5 = 0x17 < uVar12 || !bVar16;
      bVar19 = minorVer == 0x17;
joined_r0x0042e89a:
      bVar19 = bVar19 && bVar17;
      goto joined_r0x0042e76f;
    case CMP0130:
    case CMP0131:
    case CMP0132:
    case CMP0133:
    case CMP0134:
    case CMP0135:
    case CMP0136:
    case CMP0137:
    case CMP0138:
    case CMP0139:
      bVar5 = 0x18 < uVar12 || !bVar16;
      bVar19 = minorVer == 0x18;
      goto joined_r0x0042e76f;
    case CMP0140:
    case CMP0141:
    case CMP0142:
      bVar5 = 0x19 < uVar12 || !bVar16;
      bVar19 = minorVer == 0x19;
joined_r0x0042e76f:
      bVar19 = bVar19 && patchVer == 0xffffffff;
      goto joined_r0x0042e76f;
    default:
      goto switchD_0042e660_default;
    }
    bVar19 = bVar19 && bVar17;
joined_r0x0042e76f:
    uVar2 = bVar19 && bVar16;
    if (bVar5 && 2 < majorVer) {
LAB_0042e8e5:
      if ((bool)uVar2) goto LAB_0042e8ed;
switchD_0042e660_default:
      bVar5 = cmMakefile::SetPolicy(this_00,id,NEW);
      if (!bVar5) {
        return bVar15;
      }
    }
    else {
LAB_0042e8ed:
      __s = idToString(id);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,__s,&local_221);
      std::operator+(&local_1f8,"CMAKE_POLICY_DEFAULT_",&local_218);
      psVar9 = cmMakefile::GetSafeDefinition(this_00,&local_1f8);
      iVar6 = std::__cxx11::string::compare((char *)psVar9);
      bVar5 = true;
      if (iVar6 == 0) {
        status = NEW;
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)psVar9);
        if (iVar7 == 0) {
          status = OLD;
        }
        else {
          status = WARN;
          if (psVar9->_M_string_length != 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,
                                 local_1f8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," has value \"",0xc);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,"\" but must be \"OLD\", \"NEW\", or \"\" (empty).",0x2a);
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(local_220,FATAL_ERROR,&local_1d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
              operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base((ios_base *)(local_198 + 0x60));
            bVar5 = false;
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      this_00 = local_220;
      if (!bVar5) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p == &local_218.field_2) {
          return bVar15;
        }
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        return bVar15;
      }
      bVar5 = cmMakefile::SetPolicy(local_220,id,status);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if (!bVar5) {
        return bVar15;
      }
      if (id == CMP0001 && iVar6 != 0) {
        this = cmMakefile::GetState(this_00);
        local_1a8._0_8_ = (cmState *)local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"CMAKE_BACKWARDS_COMPATIBILITY","");
        cVar11 = cmState::GetInitializedCacheValue(this,(string *)local_1a8);
        if ((cmState *)local_1a8._0_8_ != (cmState *)local_198) {
          operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
        }
        if (cVar11.Value == (string *)0x0) {
          local_1a8._0_8_ = (cmState *)local_198;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"CMAKE_BACKWARDS_COMPATIBILITY","");
          cmMakefile::AddCacheDefinition
                    (this_00,(string *)local_1a8,"2.4",
                     "For backwards compatibility, what version of CMake commands and syntax should this version of CMake try to support."
                     ,STRING,false);
          if ((cmState *)local_1a8._0_8_ != (cmState *)local_198) {
            operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
          }
        }
      }
    }
    id = id + CMP0001;
    bVar15 = id == CMPCOUNT;
    if (bVar15) {
      return bVar15;
    }
  } while( true );
}

Assistant:

bool cmPolicies::ApplyPolicyVersion(cmMakefile* mf, unsigned int majorVer,
                                    unsigned int minorVer,
                                    unsigned int patchVer,
                                    WarnCompat warnCompat)
{
  // Warn about policy versions for which support will be removed.
  if (warnCompat == WarnCompat::On &&
      (majorVer < 2 || (majorVer == 2 && minorVer < 8) ||
       (majorVer == 2 && minorVer == 8 && patchVer < 12)) &&
      // Avoid warning on calls generated by install(EXPORT)
      // in CMake versions prior to 3.18.
      !(majorVer == 2 && minorVer == 6 && patchVer == 0 &&
        mf->GetStateSnapshot().CanPopPolicyScope() &&
        cmSystemTools::Strucmp(mf->GetBacktrace().Top().Name.c_str(),
                               "cmake_policy") == 0)) {
    mf->IssueMessage(
      MessageType::DEPRECATION_WARNING,
      "Compatibility with CMake < 2.8.12 will be removed from "
      "a future version of CMake.\n"
      "Update the VERSION argument <min> value or use a ...<max> suffix "
      "to tell CMake that the project does not need compatibility with "
      "older versions.");
  }

  // now loop over all the policies and set them as appropriate
  std::vector<cmPolicies::PolicyID> ancientPolicies;
  for (PolicyID pid = cmPolicies::CMP0000; pid != cmPolicies::CMPCOUNT;
       pid = static_cast<PolicyID>(pid + 1)) {
    if (isPolicyNewerThan(pid, majorVer, minorVer, patchVer)) {
      if (cmPolicies::GetPolicyStatus(pid) == cmPolicies::REQUIRED_ALWAYS) {
        ancientPolicies.push_back(pid);
      } else {
        cmPolicies::PolicyStatus status = cmPolicies::WARN;
        if (!GetPolicyDefault(mf, idToString(pid), &status) ||
            !mf->SetPolicy(pid, status)) {
          return false;
        }
        if (pid == cmPolicies::CMP0001 &&
            (status == cmPolicies::WARN || status == cmPolicies::OLD)) {
          if (!(mf->GetState()->GetInitializedCacheValue(
                "CMAKE_BACKWARDS_COMPATIBILITY"))) {
            // Set it to 2.4 because that is the last version where the
            // variable had meaning.
            mf->AddCacheDefinition(
              "CMAKE_BACKWARDS_COMPATIBILITY", "2.4",
              "For backwards compatibility, what version of CMake "
              "commands and "
              "syntax should this version of CMake try to support.",
              cmStateEnums::STRING);
          }
        }
      }
    } else {
      if (!mf->SetPolicy(pid, cmPolicies::NEW)) {
        return false;
      }
    }
  }

  // Make sure the project does not use any ancient policies.
  if (!ancientPolicies.empty()) {
    DiagnoseAncientPolicies(ancientPolicies, majorVer, minorVer, patchVer, mf);
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  return true;
}